

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx,SQBool freemem)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQBool in_RDI;
  SQArray *unaff_retaddr;
  SQObject *o;
  SQChar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQInteger in_stack_fffffffffffffff8;
  
  pSVar2 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (SQInteger)in_stack_ffffffffffffffc8);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    SQArray::Resize(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  }
  else {
    if (SVar1 != OT_TABLE) {
      SVar3 = sq_throwerror((HSQUIRRELVM)CONCAT44(SVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
      return SVar3;
    }
    SQTable::Clear((SQTable *)CONCAT44(0xa000020,in_stack_ffffffffffffffd0),
                   (SQBool)in_stack_ffffffffffffffc8);
  }
  return 0;
}

Assistant:

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx, SQBool freemem)
{
    SQObject &o=stack_get(v,idx);
    switch(sq_type(o)) {
        case OT_TABLE: _table(o)->Clear(freemem);  break;
        case OT_ARRAY: _array(o)->Resize(0, freemem); break;
        default:
            return sq_throwerror(v, _SC("clear only works on table and array"));
        break;

    }
    return SQ_OK;
}